

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTypeFunction(ValidationState_t *_,Instruction *inst)

{
  ulong uVar1;
  Instruction *pIVar2;
  bool bVar3;
  Op OVar4;
  int32_t iVar5;
  uint id;
  uint32_t id_00;
  DiagnosticStream *pDVar6;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar7;
  spv_const_validator_options psVar8;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *this_00;
  string local_a58;
  DiagnosticStream local_a38;
  Instruction *local_860;
  Instruction *use;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *pair;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range2;
  DiagnosticStream local_818;
  uint local_63c;
  undefined1 local_638 [4];
  uint32_t num_function_args_limit;
  DiagnosticStream local_618;
  string local_440;
  DiagnosticStream local_420;
  Instruction *local_248;
  Instruction *param_type;
  ulong uStack_238;
  uint param_id;
  size_t param_type_index;
  size_t num_args;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *return_type;
  Instruction *pIStack_20;
  uint return_type_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  return_type._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,1);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,return_type._4_4_);
  if (local_30 != (Instruction *)0x0) {
    OVar4 = Instruction::opcode(local_30);
    iVar5 = spvOpcodeGeneratesType(OVar4);
    if (iVar5 != 0) {
      param_type_index = 0;
      uStack_238 = 2;
      while( true ) {
        uVar1 = uStack_238;
        this = Instruction::operands(pIStack_20);
        sVar7 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this)
        ;
        if (sVar7 <= uVar1) {
          psVar8 = ValidationState_t::options((ValidationState_t *)inst_local);
          local_63c = (psVar8->universal_limits_).max_function_args;
          if (local_63c < param_type_index) {
            ValidationState_t::diag
                      (&local_818,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
            pDVar6 = DiagnosticStream::operator<<
                               (&local_818,(char (*) [39])"OpTypeFunction may not take more than ");
            pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_63c);
            pDVar6 = DiagnosticStream::operator<<
                               (pDVar6,(char (*) [33])" arguments. OpTypeFunction <id> ");
            pIVar2 = inst_local;
            id = Instruction::GetOperandAs<unsigned_int>(pIStack_20,0);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&__range2,(ValidationState_t *)pIVar2,id);
            pDVar6 = DiagnosticStream::operator<<
                               (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&__range2);
            pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [6])0x3e00da);
            pDVar6 = DiagnosticStream::operator<<(pDVar6,&param_type_index);
            pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [12])" arguments.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            std::__cxx11::string::~string((string *)&__range2);
            DiagnosticStream::~DiagnosticStream(&local_818);
            return __local._4_4_;
          }
          this_00 = Instruction::uses(pIStack_20);
          __end2 = std::
                   vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ::begin(this_00);
          pair = (pair<const_spvtools::val::Instruction_*,_unsigned_int> *)
                 std::
                 vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                 ::end(this_00);
          do {
            bVar3 = __gnu_cxx::operator!=
                              (&__end2,(__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                        *)&pair);
            if (!bVar3) {
              return SPV_SUCCESS;
            }
            use = (Instruction *)
                  __gnu_cxx::
                  __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                  ::operator*(&__end2);
            local_860 = (Instruction *)
                        (use->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
            OVar4 = Instruction::opcode(local_860);
            if (OVar4 != OpFunction) {
              OVar4 = Instruction::opcode(local_860);
              bVar3 = spvOpcodeIsDebug(OVar4);
              if ((!bVar3) && (bVar3 = Instruction::IsNonSemantic(local_860), !bVar3)) {
                OVar4 = Instruction::opcode(local_860);
                bVar3 = spvOpcodeIsDecoration(OVar4);
                if (!bVar3) {
                  ValidationState_t::diag
                            (&local_a38,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                             local_860);
                  pDVar6 = DiagnosticStream::operator<<
                                     (&local_a38,
                                      (char (*) [40])"Invalid use of function type result id ");
                  pIVar2 = inst_local;
                  id_00 = Instruction::id(pIStack_20);
                  ValidationState_t::getIdName_abi_cxx11_
                            (&local_a58,(ValidationState_t *)pIVar2,id_00);
                  pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_a58);
                  pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [2])0x3cdc5b);
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                  std::__cxx11::string::~string((string *)&local_a58);
                  DiagnosticStream::~DiagnosticStream(&local_a38);
                  return __local._4_4_;
                }
              }
            }
            __gnu_cxx::
            __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
            ::operator++(&__end2);
          } while( true );
        }
        param_type._4_4_ = Instruction::GetOperandAs<unsigned_int>(pIStack_20,uStack_238);
        local_248 = ValidationState_t::FindDef((ValidationState_t *)inst_local,param_type._4_4_);
        if (local_248 == (Instruction *)0x0) break;
        OVar4 = Instruction::opcode(local_248);
        iVar5 = spvOpcodeGeneratesType(OVar4);
        if (iVar5 == 0) break;
        OVar4 = Instruction::opcode(local_248);
        if (OVar4 == OpTypeVoid) {
          ValidationState_t::diag
                    (&local_618,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
          pDVar6 = DiagnosticStream::operator<<
                             (&local_618,(char (*) [36])"OpTypeFunction Parameter Type <id> ");
          ValidationState_t::getIdName_abi_cxx11_
                    ((string *)local_638,(ValidationState_t *)inst_local,param_type._4_4_);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_638);
          pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [23])" cannot be OpTypeVoid.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)local_638);
          DiagnosticStream::~DiagnosticStream(&local_618);
          return __local._4_4_;
        }
        uStack_238 = uStack_238 + 1;
        param_type_index = param_type_index + 1;
      }
      ValidationState_t::diag
                (&local_420,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_420,(char (*) [36])"OpTypeFunction Parameter Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                (&local_440,(ValidationState_t *)inst_local,param_type._4_4_);
      pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_440);
      pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [16])" is not a type.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      std::__cxx11::string::~string((string *)&local_440);
      DiagnosticStream::~DiagnosticStream(&local_420);
      return __local._4_4_;
    }
  }
  ValidationState_t::diag
            (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  pDVar6 = DiagnosticStream::operator<<
                     (&local_208,(char (*) [33])"OpTypeFunction Return Type <id> ");
  ValidationState_t::getIdName_abi_cxx11_
            ((string *)&num_args,(ValidationState_t *)inst_local,return_type._4_4_);
  pDVar6 = DiagnosticStream::operator<<
                     (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &num_args);
  pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [16])" is not a type.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
  std::__cxx11::string::~string((string *)&num_args);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTypeFunction(ValidationState_t& _,
                                  const Instruction* inst) {
  const auto return_type_id = inst->GetOperandAs<uint32_t>(1);
  const auto return_type = _.FindDef(return_type_id);
  if (!return_type || !spvOpcodeGeneratesType(return_type->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpTypeFunction Return Type <id> " << _.getIdName(return_type_id)
           << " is not a type.";
  }
  size_t num_args = 0;
  for (size_t param_type_index = 2; param_type_index < inst->operands().size();
       ++param_type_index, ++num_args) {
    const auto param_id = inst->GetOperandAs<uint32_t>(param_type_index);
    const auto param_type = _.FindDef(param_id);
    if (!param_type || !spvOpcodeGeneratesType(param_type->opcode())) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpTypeFunction Parameter Type <id> " << _.getIdName(param_id)
             << " is not a type.";
    }

    if (param_type->opcode() == spv::Op::OpTypeVoid) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpTypeFunction Parameter Type <id> " << _.getIdName(param_id)
             << " cannot be OpTypeVoid.";
    }
  }
  const uint32_t num_function_args_limit =
      _.options()->universal_limits_.max_function_args;
  if (num_args > num_function_args_limit) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpTypeFunction may not take more than "
           << num_function_args_limit << " arguments. OpTypeFunction <id> "
           << _.getIdName(inst->GetOperandAs<uint32_t>(0)) << " has "
           << num_args << " arguments.";
  }

  // The only valid uses of OpTypeFunction are in an OpFunction, debugging, or
  // decoration instruction.
  for (auto& pair : inst->uses()) {
    const auto* use = pair.first;
    if (use->opcode() != spv::Op::OpFunction &&
        !spvOpcodeIsDebug(use->opcode()) && !use->IsNonSemantic() &&
        !spvOpcodeIsDecoration(use->opcode())) {
      return _.diag(SPV_ERROR_INVALID_ID, use)
             << "Invalid use of function type result id "
             << _.getIdName(inst->id()) << ".";
    }
  }

  return SPV_SUCCESS;
}